

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formula.cpp
# Opt level: O2

void __thiscall
Formula_Context::Formula_Context
          (Formula_Context *this,Formula_Constraint *in_context,Am_Slot *in_depender,
          Dependency *depends_on)

{
  (this->super_Am_Constraint_Context)._vptr_Am_Constraint_Context = (_func_int **)&PTR_ID_002ea5d8;
  (this->depender).data = in_depender->data;
  this->last_position = (Dependency *)0x0;
  this->current_position = depends_on;
  this->context = in_context;
  this->changed = false;
  this->inited = true;
  (this->exception).type = 0;
  (this->exception).value.wrapper_value = (Am_Wrapper *)0x0;
  this->return_value_from_get = true;
  return;
}

Assistant:

Formula_Context::Formula_Context(Formula_Constraint *in_context,
                                 const Am_Slot &in_depender,
                                 Dependency *depends_on)
    : depender(in_depender), inited(true), context(in_context),
      last_position(nullptr), current_position(depends_on), changed(false),
      return_value_from_get(true)
{
  ;
}